

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

Iterator __thiscall
HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::insert
          (HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this,Iterator *position,
          Socket **key,SocketInfo *value)

{
  Item *pIVar1;
  Item *pIVar2;
  Iterator IVar3;
  bool bVar4;
  SocketInfo *pSVar5;
  Item **ppIVar6;
  ItemBlock *pIVar7;
  usize uVar8;
  Item *insertPos;
  Item **cell;
  usize hashCode;
  Item *end;
  Item *i;
  ItemBlock *itemBlock;
  Item *item;
  Iterator it;
  SocketInfo *value_local;
  Socket **key_local;
  Iterator *position_local;
  HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this_local;
  
  it.item = (Item *)value;
  item = (Item *)find(this,key);
  bVar4 = Iterator::operator!=((Iterator *)&item,&this->_end);
  IVar3 = it;
  if (bVar4) {
    pSVar5 = Iterator::operator*((Iterator *)&item);
    pSVar5->socket = (IVar3.item)->key;
    *(Socket **)&pSVar5->events = ((IVar3.item)->value).socket;
    this_local = (HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *)item;
  }
  else {
    if (this->data == (Item **)0x0) {
      ppIVar6 = (Item **)operator_new__(this->capacity << 3);
      this->data = ppIVar6;
      Memory::zero(this->data,this->capacity << 3);
    }
    if (this->freeItem == (Item *)0x0) {
      pIVar7 = (ItemBlock *)operator_new__(0xe8);
      pIVar7->next = this->blocks;
      this->blocks = pIVar7;
      itemBlock = pIVar7 + 1;
      for (end = (Item *)(pIVar7 + 8); end < (Item *)(pIVar7 + 0x1d); end = end + 1) {
        end->prev = this->freeItem;
        this->freeItem = end;
      }
    }
    else {
      itemBlock = (ItemBlock *)this->freeItem;
      this->freeItem = this->freeItem->prev;
    }
    uVar8 = hash(*key);
    Item::Item((Item *)itemBlock,key,(SocketInfo *)it.item);
    pIVar7 = (ItemBlock *)(this->data + uVar8 % this->capacity);
    itemBlock[3].next = pIVar7;
    pIVar1 = (Item *)pIVar7->next;
    itemBlock[4].next = (ItemBlock *)pIVar1;
    if (pIVar1 != (Item *)0x0) {
      itemBlock[4].next[3].next = itemBlock + 4;
    }
    pIVar7->next = itemBlock;
    pIVar1 = position->item;
    pIVar2 = pIVar1->prev;
    itemBlock[5].next = (ItemBlock *)pIVar2;
    if (pIVar2 == (Item *)0x0) {
      (this->_begin).item = (Item *)itemBlock;
    }
    else {
      pIVar1->prev->next = (Item *)itemBlock;
    }
    itemBlock[6].next = (ItemBlock *)pIVar1;
    pIVar1->prev = (Item *)itemBlock;
    this->_size = this->_size + 1;
    Iterator::Iterator((Iterator *)&this_local,(Item *)itemBlock);
  }
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Iterator it = find(key);
    if(it != _end)
    {
      *it = value;
      return it;
    }

    if(!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*) * capacity);
    }
    
    Item* item;
    if(freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for(Item* i = item + 1, * end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item) Item(key, value) == item);
#else
    new(item) Item(key, value);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;
    
    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }